

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

void __thiscall
internal_sparse_matrix::writeSparseMatrix<true>(internal_sparse_matrix *this,ostream *os)

{
  size_type sVar1;
  size_type sVar2;
  int rows;
  int nnz;
  ostream *os_local;
  internal_sparse_matrix *this_local;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->indx);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->pntr);
  TasGrid::IO::writeNumbers<true,(TasGrid::IO::IOPad)3,int,int,int>
            (os,(int)sVar2 + -1,this->num_cols,(int)sVar1);
  TasGrid::IO::writeVector<true,(TasGrid::IO::IOPad)3,int>(&this->pntr,os);
  TasGrid::IO::writeVector<true,(TasGrid::IO::IOPad)3,int>(&this->indx,os);
  TasGrid::IO::writeVector<true,(TasGrid::IO::IOPad)3,double>(&this->vals,os);
  return;
}

Assistant:

void writeSparseMatrix(std::ostream &os) const{
        int nnz = static_cast<int>(indx.size());
        int rows = static_cast<int>(pntr.size() - 1);
        IO::writeNumbers<iomode, IO::pad_line>(os, rows, num_cols, nnz);
        IO::writeVector<iomode, IO::pad_line>(pntr, os);
        IO::writeVector<iomode, IO::pad_line>(indx, os);
        IO::writeVector<iomode, IO::pad_line>(vals, os);
    }